

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.h
# Opt level: O3

FindLastMatchingRecordingRequest * __thiscall
aeron::archive::ArchiveProxy::
wrapAndApplyHeader<io::aeron::archive::codecs::FindLastMatchingRecordingRequest>
          (ArchiveProxy *this,FindLastMatchingRecordingRequest *msg)

{
  length_t lVar1;
  char *pcVar2;
  uint64_t uVar3;
  MessageHeader *pMVar4;
  MessageHeader hdr;
  MessageHeader local_38;
  
  local_38.m_buffer = (char *)0x0;
  local_38.m_offset = 0;
  pMVar4 = io::aeron::archive::codecs::MessageHeader::wrap
                     (&local_38,(char *)(this->buffer_).m_buffer,0,0,
                      (long)(int)(this->buffer_).m_length);
  pcVar2 = pMVar4->m_buffer;
  uVar3 = pMVar4->m_offset;
  (pcVar2 + uVar3)[0] = ' ';
  (pcVar2 + uVar3)[1] = '\0';
  pcVar2 = pMVar4->m_buffer;
  uVar3 = pMVar4->m_offset;
  (pcVar2 + uVar3 + 2)[0] = '\x10';
  (pcVar2 + uVar3 + 2)[1] = '\0';
  pcVar2 = pMVar4->m_buffer;
  uVar3 = pMVar4->m_offset;
  (pcVar2 + uVar3 + 4)[0] = '\x01';
  (pcVar2 + uVar3 + 4)[1] = '\0';
  pcVar2 = pMVar4->m_buffer;
  uVar3 = pMVar4->m_offset;
  (pcVar2 + uVar3 + 6)[0] = '\0';
  (pcVar2 + uVar3 + 6)[1] = '\0';
  lVar1 = (this->buffer_).m_length;
  msg->m_buffer = (char *)(this->buffer_).m_buffer;
  msg->m_offset = 8;
  msg->m_bufferLength = (long)(int)lVar1;
  msg->m_actingBlockLength = 0x20;
  msg->m_actingVersion = 0;
  msg->m_positionPtr = &msg->m_position;
  io::aeron::archive::codecs::FindLastMatchingRecordingRequest::sbePosition(msg,0x28);
  return msg;
}

Assistant:

T& wrapAndApplyHeader(T& msg) {
        constexpr std::uint64_t offset{0};
        io::aeron::archive::codecs::MessageHeader hdr;

        hdr.wrap((char*)buffer_.buffer(), offset, 0, buffer_.capacity())
            .blockLength(T::sbeBlockLength())
            .templateId(T::sbeTemplateId())
            .schemaId(T::sbeSchemaId())
            .version(T::sbeSchemaVersion());

        return msg.wrapForEncode((char*)buffer_.buffer(), offset + hdr.encodedLength(), buffer_.capacity());
    }